

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

void __thiscall MercuryJson::JSON::exec_stage1(JSON *this)

{
  long lVar1;
  uint64_t literal_mask_00;
  size_t sVar2;
  runtime_error *this_00;
  long lVar3;
  long *in_RDI;
  uint64_t literal_mask;
  uint64_t escape_mask;
  Warp warp;
  size_t offset;
  uint64_t pseudo_mask;
  uint64_t whitespace_mask;
  uint64_t structural_mask;
  uint64_t quote_mask;
  uint64_t prev_pseudo_mask;
  uint64_t prev_quote_mask;
  uint64_t prev_escape_mask;
  Warp *in_stack_000000d0;
  uint64_t *in_stack_ffffffffffffff08;
  uint64_t *in_stack_ffffffffffffff10;
  Warp *in_stack_ffffffffffffff20;
  uint64_t *in_stack_ffffffffffffff40;
  Warp *in_stack_ffffffffffffff48;
  ulong local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  long local_48;
  undefined8 local_40;
  
  local_40 = 0;
  local_48 = 0;
  local_50 = 1;
  local_70 = 0;
  for (local_78 = 0; local_78 < (ulong)in_RDI[1]; local_78 = local_78 + 0x40) {
    Warp::Warp((Warp *)&stack0xffffffffffffff40,(char *)(*in_RDI + local_78));
    extract_escape_mask(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    literal_mask_00 =
         extract_literal_mask
                   (in_stack_ffffffffffffff20,(uint64_t)in_RDI,in_stack_ffffffffffffff10,
                    in_stack_ffffffffffffff08);
    construct_structural_character_pointers
              (local_70,local_78 - 0x40,(size_t *)in_RDI[3],(size_t *)(in_RDI + 2));
    extract_structural_whitespace_characters
              (in_stack_000000d0,(uint64_t)this,(uint64_t *)prev_escape_mask,
               (uint64_t *)prev_quote_mask);
    local_70 = extract_pseudo_structural_mask(local_60,local_68,local_58,literal_mask_00,&local_50);
  }
  construct_structural_character_pointers
            (local_70,local_78 - 0x40,(size_t *)in_RDI[3],(size_t *)(in_RDI + 2));
  if (in_RDI[2] != 0) {
    if (*(char *)(*in_RDI + *(long *)(in_RDI[3] + (in_RDI[2] + -1) * 8)) == '\0') goto LAB_0013257d;
  }
  lVar3 = local_78 - 0x40;
  sVar2 = strlen((char *)(*in_RDI + local_78 + -0x40));
  lVar1 = in_RDI[2];
  in_RDI[2] = lVar1 + 1;
  *(size_t *)(in_RDI[3] + lVar1 * 8) = lVar3 + sVar2;
LAB_0013257d:
  if (local_48 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unclosed quotation marks");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void JSON::exec_stage1() {
        uint64_t prev_escape_mask = 0;
        uint64_t prev_quote_mask = 0;
        uint64_t prev_pseudo_mask = 1;  // initial value set to 1 to allow literals at beginning of input
        uint64_t quote_mask, structural_mask, whitespace_mask;
        uint64_t pseudo_mask = 0;
        size_t offset = 0;
        for (; offset < input_len; offset += 64) {
            Warp warp(input + offset);
            uint64_t escape_mask = extract_escape_mask(warp, &prev_escape_mask);
            uint64_t literal_mask = extract_literal_mask(warp, escape_mask, &prev_quote_mask, &quote_mask);

            // Dump pointers for *previous* iteration.
            construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);

            extract_structural_whitespace_characters(warp, literal_mask, &structural_mask, &whitespace_mask);
            pseudo_mask = extract_pseudo_structural_mask(
                    structural_mask, whitespace_mask, quote_mask, literal_mask, &prev_pseudo_mask);
        }
        // Dump pointers for the final iteration.
        construct_structural_character_pointers(pseudo_mask, offset - 64, indices, &num_indices);
        if (num_indices == 0 || input[indices[num_indices - 1]] != '\0')  // Ensure '\0' is added to indices.
            indices[num_indices++] = offset - 64 + strlen(input + offset - 64);
        if (prev_quote_mask != 0)
            throw std::runtime_error("unclosed quotation marks");
    }